

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndiRg<(moira::Instr)57,(moira::Mode)0,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Dn local_50 [2];
  Ims<2> local_48;
  int local_44;
  Dn local_3c [2];
  Imu<2> local_34;
  int local_30;
  byte local_29;
  u32 local_28;
  u16 uStack_22;
  u8 dst;
  u32 src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uStack_22 = op;
  _src = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_28 = dasmIncRead<2>(this,addr);
  local_29 = (byte)uStack_22 & 7;
  if (**(int **)(addr_local + 0xc) == 4) {
    pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_30 = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_30);
    Imu<2>::Imu(&local_34,local_28);
    pSVar1 = StrWriter::operator<<(pSVar1,local_34);
    pSVar1 = StrWriter::operator<<(pSVar1);
    Dn::Dn(local_3c,(uint)local_29);
    StrWriter::operator<<(pSVar1,local_3c[0]);
  }
  else {
    pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_44 = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_44);
    Ims<2>::Ims(&local_48,local_28);
    pSVar1 = StrWriter::operator<<(pSVar1,local_48);
    pSVar1 = StrWriter::operator<<(pSVar1);
    Dn::Dn(local_50,(uint)local_29);
    StrWriter::operator<<(pSVar1,local_50[0]);
  }
  return;
}

Assistant:

void
Moira::dasmAndiRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = _____________xxx(op);

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << Dn{dst};
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << Sep{} << Dn{dst};
    }
}